

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptorKeyAndModuleName
          (Generator *this,ServiceDescriptor *descriptor)

{
  string *psVar1;
  undefined1 local_a8 [8];
  string module_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string name;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  
  name.field_2._8_8_ = descriptor;
  ModuleLevelServiceDescriptorName_abi_cxx11_((string *)local_38,this,descriptor);
  if ((this->pure_python_workable_ & 1U) == 0) {
    psVar1 = ServiceDescriptor::full_name_abi_cxx11_((ServiceDescriptor *)name.field_2._8_8_);
    std::operator+(&local_78,"_descriptor.ServiceDescriptor(full_name=\'",psVar1);
    std::operator+(&local_58,&local_78,"\')");
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  io::Printer::Print<char[15],char[11],char[16],std::__cxx11::string>
            (this->printer_,"$descriptor_key$ = $descriptor_name$,\n",
             (char (*) [15])"descriptor_key",(char (*) [11])"DESCRIPTOR",(char (*) [16])0x77ead1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  psVar1 = FileDescriptor::name_abi_cxx11_(this->file_);
  anon_unknown_0::ModuleName((string *)local_a8,psVar1);
  io::Printer::Print<char[12],std::__cxx11::string>
            (this->printer_,"__module__ = \'$module_name$\'\n",(char (*) [12])"module_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Generator::PrintDescriptorKeyAndModuleName(
    const ServiceDescriptor& descriptor) const {
  std::string name = ModuleLevelServiceDescriptorName(descriptor);
  if (!pure_python_workable_) {
    name = "_descriptor.ServiceDescriptor(full_name='" +
           descriptor.full_name() + "')";
  }
  printer_->Print("$descriptor_key$ = $descriptor_name$,\n", "descriptor_key",
                  kDescriptorKey, "descriptor_name", name);
  std::string module_name = ModuleName(file_->name());
  printer_->Print("__module__ = '$module_name$'\n", "module_name", module_name);
}